

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::xml_document::_destroy(xml_document *this)

{
  xml_memory_page *pxVar1;
  xml_document *pxVar2;
  bool bVar3;
  xml_memory_page *next;
  xml_memory_page *page;
  xml_memory_page *root_page;
  xml_extra_buffer *extra;
  xml_document *this_local;
  
  if ((this->super_xml_node)._root == (xml_node_struct *)0x0) {
    __assert_fail("_root",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1b44,"void pugi::xml_document::_destroy()");
  }
  if (this->_buffer != (char_t *)0x0) {
    (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (this->_buffer);
    this->_buffer = (char_t *)0x0;
  }
  for (root_page = (xml_memory_page *)(this->super_xml_node)._root[1].parent;
      root_page != (xml_memory_page *)0x0; root_page = root_page->prev) {
    if (root_page->allocator != (xml_allocator *)0x0) {
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(root_page->allocator);
    }
  }
  pxVar2 = (xml_document *)
           ((long)(this->super_xml_node)._root - (((this->super_xml_node)._root)->header >> 8));
  bVar3 = false;
  if (pxVar2 != (xml_document *)0x0) {
    bVar3 = pxVar2->_buffer == (char_t *)0x0;
  }
  if (!bVar3) {
    __assert_fail("root_page && !root_page->prev",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1b55,"void pugi::xml_document::_destroy()");
  }
  if (pxVar2 < this->_memory || this + 1 <= pxVar2) {
    __assert_fail("reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1b56,"void pugi::xml_document::_destroy()");
  }
  next = *(xml_memory_page **)pxVar2->_memory;
  while (next != (xml_memory_page *)0x0) {
    pxVar1 = next->next;
    impl::anon_unknown_0::xml_allocator::deallocate_page(next);
    next = pxVar1;
  }
  (this->super_xml_node)._root = (xml_node_struct *)0x0;
  return;
}

Assistant:

PUGI__FN void xml_document::_destroy()
	{
		assert(_root);

		// destroy static storage
		if (_buffer)
		{
			impl::xml_memory::deallocate(_buffer);
			_buffer = 0;
		}

		// destroy extra buffers (note: no need to destroy linked list nodes, they're allocated using document allocator)
		for (impl::xml_extra_buffer* extra = static_cast<impl::xml_document_struct*>(_root)->extra_buffers; extra; extra = extra->next)
		{
			if (extra->buffer) impl::xml_memory::deallocate(extra->buffer);
		}

		// destroy dynamic storage, leave sentinel page (it's in static memory)
		impl::xml_memory_page* root_page = PUGI__GETPAGE(_root);
		assert(root_page && !root_page->prev);
		assert(reinterpret_cast<char*>(root_page) >= _memory && reinterpret_cast<char*>(root_page) < _memory + sizeof(_memory));

		for (impl::xml_memory_page* page = root_page->next; page; )
		{
			impl::xml_memory_page* next = page->next;

			impl::xml_allocator::deallocate_page(page);

			page = next;
		}

	#ifdef PUGIXML_COMPACT
		// destroy hash table
		static_cast<impl::xml_document_struct*>(_root)->hash.clear();
	#endif

		_root = 0;
	}